

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_props.cpp
# Opt level: O3

int32_t icu_63::ICU_Utility::parsePattern
                  (UnicodeString *rule,int32_t pos,int32_t limit,UnicodeString *pattern,
                  int32_t *parsedInts)

{
  short sVar1;
  char16_t cVar2;
  UBool UVar3;
  uint uVar4;
  int32_t iVar5;
  UChar32 UVar6;
  int iVar7;
  char16_t *pcVar8;
  long lVar9;
  uint uVar10;
  int iVar11;
  int32_t p;
  uint local_54;
  int local_50;
  uint local_4c;
  char16_t *local_48;
  int32_t *local_40;
  char16_t *local_38;
  
  sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
  uVar4 = (uint)sVar1;
  if (sVar1 < 0) {
    iVar11 = (pattern->fUnion).fFields.fLength;
  }
  else {
    iVar11 = (int)uVar4 >> 5;
  }
  if (0 < iVar11) {
    local_38 = (char16_t *)((long)&pattern->fUnion + 2);
    local_48 = (char16_t *)((long)&rule->fUnion + 2);
    lVar9 = 0;
    iVar11 = 0;
    local_54 = pos;
    local_50 = limit;
    local_40 = parsedInts;
    do {
      pcVar8 = local_38;
      if ((uVar4 & 2) == 0) {
        pcVar8 = (pattern->fUnion).fFields.fArray;
      }
      cVar2 = pcVar8[lVar9];
      if (cVar2 == L'~') {
LAB_0037ed35:
        local_54 = skipWhitespace(rule,(int32_t *)&local_54,'\0');
      }
      else if (cVar2 == L'#') {
        local_4c = local_54;
        iVar5 = parseInteger(rule,(int32_t *)&local_4c,local_50);
        local_40[iVar11] = iVar5;
        if (local_4c == local_54) {
          return -1;
        }
        iVar11 = iVar11 + 1;
        local_54 = local_4c;
      }
      else {
        if (cVar2 == L' ') {
          if (local_50 <= (int)local_54) {
            return -1;
          }
          sVar1 = (rule->fUnion).fStackFields.fLengthAndFlags;
          if (sVar1 < 0) {
            uVar4 = (rule->fUnion).fFields.fLength;
          }
          else {
            uVar4 = (int)sVar1 >> 5;
          }
          uVar10 = 0xffff;
          if (local_54 < uVar4) {
            pcVar8 = local_48;
            if (((int)sVar1 & 2U) == 0) {
              pcVar8 = (rule->fUnion).fFields.fArray;
            }
            uVar10 = (uint)(ushort)pcVar8[(int)local_54];
          }
          local_54 = local_54 + 1;
          UVar3 = PatternProps::isWhiteSpace(uVar10);
          if (UVar3 == '\0') {
            return -1;
          }
          goto LAB_0037ed35;
        }
        if (local_50 <= (int)local_54) {
          return -1;
        }
        sVar1 = (rule->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          uVar4 = (rule->fUnion).fFields.fLength;
        }
        else {
          uVar4 = (int)sVar1 >> 5;
        }
        uVar10 = 0xffff;
        if (local_54 < uVar4) {
          pcVar8 = local_48;
          if (((int)sVar1 & 2U) == 0) {
            pcVar8 = (rule->fUnion).fFields.fArray;
          }
          uVar10 = (uint)(ushort)pcVar8[(int)local_54];
        }
        local_54 = local_54 + 1;
        UVar6 = u_tolower_63(uVar10);
        if (cVar2 != (char16_t)UVar6) {
          return -1;
        }
      }
      sVar1 = (pattern->fUnion).fStackFields.fLengthAndFlags;
      uVar4 = (uint)sVar1;
      if (sVar1 < 0) {
        iVar7 = (pattern->fUnion).fFields.fLength;
      }
      else {
        iVar7 = (int)uVar4 >> 5;
      }
      lVar9 = lVar9 + 1;
      pos = local_54;
    } while (lVar9 < iVar7);
  }
  return pos;
}

Assistant:

int32_t ICU_Utility::parsePattern(const UnicodeString& rule, int32_t pos, int32_t limit,
                              const UnicodeString& pattern, int32_t* parsedInts) {
    // TODO Update this to handle surrogates
    int32_t p;
    int32_t intCount = 0; // number of integers parsed
    for (int32_t i=0; i<pattern.length(); ++i) {
        UChar cpat = pattern.charAt(i);
        UChar c;
        switch (cpat) {
        case 32 /*' '*/:
            if (pos >= limit) {
                return -1;
            }
            c = rule.charAt(pos++);
            if (!PatternProps::isWhiteSpace(c)) {
                return -1;
            }
            // FALL THROUGH to skipWhitespace
            U_FALLTHROUGH;
        case 126 /*'~'*/:
            pos = skipWhitespace(rule, pos);
            break;
        case 35 /*'#'*/:
            p = pos;
            parsedInts[intCount++] = parseInteger(rule, p, limit);
            if (p == pos) {
                // Syntax error; failed to parse integer
                return -1;
            }
            pos = p;
            break;
        default:
            if (pos >= limit) {
                return -1;
            }
            c = (UChar) u_tolower(rule.charAt(pos++));
            if (c != cpat) {
                return -1;
            }
            break;
        }
    }
    return pos;
}